

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O2

Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
* __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>
::
multiply_target_and_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>
          (Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>
           *this,Field_element *val,
          Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
          *column)

{
  if (*val == false) {
    Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
    ::clear((Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
             *)this);
  }
  _add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>
            (this,column);
  return (Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
          *)this;
}

Assistant:

inline Vector_column<Master_matrix>& Vector_column<Master_matrix>::multiply_target_and_add(const Field_element& val,
                                                                                           const Entry_range& column)
{
  static_assert((!Master_matrix::isNonBasic || std::is_same_v<Entry_range, Vector_column>),
                "For boundary columns, the range has to be a column of same type to help ensure the validity of the "
                "base element.");  // could be removed, if we give the responsibility to the user.
  static_assert((!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type),
                "For chain columns, the given column cannot be constant.");

  if constexpr (Master_matrix::Option_list::is_z2) {
    if (val) {
      _add(column);
    } else {
      clear();
      _add(column);
    }
  } else {
    _multiply_target_and_add(val, column);
  }

  return *this;
}